

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_dec
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> *this)

{
  undefined1 n [16];
  string_view prefix;
  int num_digits_00;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar1;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> *in_RDI;
  size_t unaff_retaddr;
  buffer_appender<char> in_stack_00000008;
  anon_class_16_2_cb75083a_for_f_conflict1 in_stack_00000020;
  int num_digits;
  undefined8 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  basic_format_specs<char> *in_stack_ffffffffffffffe8;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> *pbVar2;
  
  n._8_4_ = in_stack_ffffffffffffff98;
  n._0_8_ = in_stack_ffffffffffffff90;
  n._12_4_ = in_stack_ffffffffffffff9c;
  pbVar2 = in_RDI;
  num_digits_00 = count_digits((uint128_t)n);
  get_prefix((int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> *)0x191852
            );
  prefix.size_ = unaff_retaddr;
  prefix.data_ = (char *)pbVar2;
  bVar1.container =
       (buffer<char> *)
       write_int<fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned__int128>::on_dec()::_lambda(fmt::v7::detail::buffer_appender<char>)_1_>
                 (in_stack_00000008,num_digits_00,prefix,in_stack_ffffffffffffffe8,in_stack_00000020
                 );
  in_RDI->container = bVar1.container;
  return;
}

Assistant:

void on_dec() {
    auto num_digits = count_digits(abs_value);
    out = write_int(
        out, num_digits, get_prefix(), specs, [this, num_digits](iterator it) {
          return format_decimal<Char>(it, abs_value, num_digits).end;
        });
  }